

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::draw
          (PrimitiveRestartCase *this,int startNdx,int count)

{
  IndexType IVar1;
  int iVar2;
  deUint32 dVar3;
  void *pvVar4;
  deUint32 local_54;
  deUint32 local_50;
  int local_30;
  deUint32 index;
  int i;
  int numIndices;
  deUint32 max;
  deUint32 restartIndex;
  GLenum indexTypeGL;
  GLenum primTypeGL;
  int count_local;
  int startNdx_local;
  PrimitiveRestartCase *this_local;
  
  switch(this->m_primType) {
  case PRIMITIVE_POINTS:
    restartIndex = 0;
    break;
  case PRIMITIVE_LINE_STRIP:
    restartIndex = 3;
    break;
  case PRIMITIVE_LINE_LOOP:
    restartIndex = 2;
    break;
  case PRIMITIVE_LINES:
    restartIndex = 1;
    break;
  case PRIMITIVE_TRIANGLE_STRIP:
    restartIndex = 5;
    break;
  case PRIMITIVE_TRIANGLE_FAN:
    restartIndex = 6;
    break;
  case PRIMITIVE_TRIANGLES:
    restartIndex = 4;
    break;
  default:
    restartIndex = 0;
  }
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    max = 0x1401;
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    max = 0x1403;
  }
  else if (IVar1 == INDEX_UNSIGNED_INT) {
    max = 0x1405;
  }
  else {
    max = 0;
  }
  if (this->m_indexType == INDEX_UNSIGNED_BYTE) {
    local_50 = 0xff;
  }
  else {
    if (this->m_indexType == INDEX_UNSIGNED_SHORT) {
      local_54 = 0xffff;
    }
    else {
      local_54 = 0;
      if (this->m_indexType == INDEX_UNSIGNED_INT) {
        local_54 = 0xffffffff;
      }
    }
    local_50 = local_54;
  }
  if (this->m_function == FUNCTION_DRAW_ELEMENTS) {
    pvVar4 = getIndexPtr(this,startNdx);
    glwDrawElements(restartIndex,count,max,pvVar4);
  }
  else if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
    pvVar4 = getIndexPtr(this,startNdx);
    glwDrawElementsInstanced(restartIndex,count,max,pvVar4,1);
  }
  else {
    i = 0;
    iVar2 = getNumIndices(this);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      dVar3 = getIndex(this,local_30);
      if ((dVar3 != local_50) && ((uint)i < dVar3)) {
        i = dVar3;
      }
    }
    pvVar4 = getIndexPtr(this,startNdx);
    glwDrawRangeElements(restartIndex,0,i,count,max,pvVar4);
  }
  return;
}

Assistant:

void PrimitiveRestartCase::draw (int startNdx, int count)
{
	GLenum primTypeGL;

	switch (m_primType)
	{
		case PRIMITIVE_POINTS:			primTypeGL = GL_POINTS;			break;
		case PRIMITIVE_LINE_STRIP:		primTypeGL = GL_LINE_STRIP;		break;
		case PRIMITIVE_LINE_LOOP:		primTypeGL = GL_LINE_LOOP;		break;
		case PRIMITIVE_LINES:			primTypeGL = GL_LINES;			break;
		case PRIMITIVE_TRIANGLE_STRIP:	primTypeGL = GL_TRIANGLE_STRIP;	break;
		case PRIMITIVE_TRIANGLE_FAN:	primTypeGL = GL_TRIANGLE_FAN;	break;
		case PRIMITIVE_TRIANGLES:		primTypeGL = GL_TRIANGLES;		break;
		default:
			DE_ASSERT(DE_FALSE);
			primTypeGL = 0;
	}

	GLenum indexTypeGL;

	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	indexTypeGL = GL_UNSIGNED_BYTE;		break;
		case INDEX_UNSIGNED_SHORT:	indexTypeGL = GL_UNSIGNED_SHORT;	break;
		case INDEX_UNSIGNED_INT:	indexTypeGL = GL_UNSIGNED_INT;		break;
		default:
			DE_ASSERT(DE_FALSE);
			indexTypeGL = 0;
	}

	deUint32 restartIndex = m_indexType == INDEX_UNSIGNED_BYTE	? RESTART_INDEX_UNSIGNED_BYTE
						  : m_indexType == INDEX_UNSIGNED_SHORT	? RESTART_INDEX_UNSIGNED_SHORT
						  : m_indexType == INDEX_UNSIGNED_INT	? RESTART_INDEX_UNSIGNED_INT
						  : 0;

	DE_ASSERT(restartIndex != 0);

	if (m_function == FUNCTION_DRAW_ELEMENTS)
		glDrawElements(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	else if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
		glDrawElementsInstanced(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx), 1);
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_RANGE_ELEMENTS);

		// Find the largest non-restart index in the index array (for glDrawRangeElements() end parameter).

		deUint32 max = 0;

		int numIndices = getNumIndices();
		for (int i = 0; i < numIndices; i++)
		{
			deUint32 index = getIndex(i);
			if (index != restartIndex && index > max)
				max = index;
		}

		glDrawRangeElements(primTypeGL, 0, (GLuint)max, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	}
}